

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datahashtable.h
# Opt level: O2

int __thiscall
soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::remove
          (DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this,char *__filename)

{
  char *pcVar1;
  char *pcVar2;
  int in_EDX;
  
  pcVar2 = index(this,__filename,in_EDX);
  if (-1 < (int)pcVar2) {
    pcVar2 = (char *)(((ulong)pcVar2 & 0xffffffff) * 0x18);
    pcVar1 = pcVar2 + (long)&((this->m_elem).data.
                              super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->stat;
    pcVar1[0] = '\x01';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    this->m_used = this->m_used + -1;
  }
  return (int)pcVar2;
}

Assistant:

void remove(const HashItem& h)
   {
      int i = index(h);

      if(i < 0)
         return;

      m_elem[i].stat = Elem::RELEASED;
      m_used--;
      assert(!has(h));
   }